

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimerinfo_unix.cpp
# Opt level: O0

optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> __thiscall
QTimerInfoList::timerWait(QTimerInfoList *this)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  long in_FS_OFFSET;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar5;
  Duration timeToWait;
  const_iterator it;
  anon_class_1_0_00000001_for__M_pred isWaiting;
  time_point now;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  nanoseconds in_stack_ffffffffffffff68;
  const_iterator local_30;
  undefined1 local_21;
  duration local_20;
  _Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true> local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.__r = (rep)&DAT_aaaaaaaaaaaaaaaa;
  local_20.__r = (rep)updateCurrentTime(in_stack_ffffffffffffff68.__r);
  local_21 = 0xaa;
  local_30.i = (QTimerInfo **)&DAT_aaaaaaaaaaaaaaaa;
  cVar2 = QList<QTimerInfo_*>::cbegin
                    ((QList<QTimerInfo_*> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  cVar3 = QList<QTimerInfo_*>::cend
                    ((QList<QTimerInfo_*> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  local_30 = std::find_if<QList<QTimerInfo*>::const_iterator,QTimerInfoList::timerWait()::__0>
                       (cVar2.i,cVar3.i);
  cVar2 = QList<QTimerInfo_*>::cend
                    ((QList<QTimerInfo_*> *)
                     CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  bVar1 = QList<QTimerInfo_*>::const_iterator::operator==(&local_30,cVar2);
  if (bVar1) {
    std::optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::optional
              ((optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)&local_18);
    uVar4 = extraout_RDX;
  }
  else {
    QList<QTimerInfo_*>::const_iterator::operator*(&local_30);
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    ns<(char)48>();
    bVar1 = std::chrono::operator>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       &in_stack_ffffffffffffff58->__d);
    if (bVar1) {
      roundToMillisecond(in_stack_ffffffffffffff68);
      std::optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::
      optional<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true>
                ((optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff58);
      uVar4 = extraout_RDX_00;
    }
    else {
      ms<(char)48>();
      std::optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::
      optional<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true>
                ((optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                 (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff58);
      uVar4 = extraout_RDX_01;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar5.
    super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
    _M_payload.
    super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>._9_7_ =
         (undefined7)((ulong)uVar4 >> 8);
    oVar5.
    super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
    _M_payload.
    super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
    _M_engaged = (bool)local_10;
    oVar5.
    super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
    _M_payload.
    super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
    _M_payload = local_18;
    return (optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
           oVar5.
           super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<QTimerInfoList::Duration> QTimerInfoList::timerWait()
{
    steady_clock::time_point now = updateCurrentTime();

    auto isWaiting = [](QTimerInfo *tinfo) { return !tinfo->activateRef; };
    // Find first waiting timer not already active
    auto it = std::find_if(timers.cbegin(), timers.cend(), isWaiting);
    if (it == timers.cend())
        return std::nullopt;

    Duration timeToWait = (*it)->timeout - now;
    if (timeToWait > 0ns)
        return roundToMillisecond(timeToWait);
    return 0ms;
}